

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cpp
# Opt level: O1

bool __thiscall sqlite::Connection::Stmt::step(Stmt *this)

{
  uint sqlite_error_code;
  Logic_error *this_00;
  long *plVar1;
  char *pcVar2;
  size_type *psVar3;
  allocator local_91;
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  sqlite_error_code = sqlite3_step(this->stmt_);
  if ((sqlite_error_code & 0xfffffffe) == 100) {
    return sqlite_error_code == 100;
  }
  this_00 = (Logic_error *)__cxa_allocate_exception(0x48);
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"Error evaluating SQL: ","");
  sqlite3_errmsg(this->db_);
  plVar1 = (long *)std::__cxx11::string::append((char *)local_70);
  local_90._M_dataplus._M_p = (pointer)*plVar1;
  psVar3 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_90._M_dataplus._M_p == psVar3) {
    local_90.field_2._M_allocated_capacity = *psVar3;
    local_90.field_2._8_4_ = (undefined4)plVar1[3];
    local_90.field_2._12_4_ = *(undefined4 *)((long)plVar1 + 0x1c);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar3;
  }
  local_90._M_string_length = plVar1[1];
  *plVar1 = (long)psVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  pcVar2 = (char *)sqlite3_sql(this->stmt_);
  std::__cxx11::string::string((string *)&local_50,pcVar2,&local_91);
  Logic_error::Logic_error(this_00,&local_90,&local_50,sqlite_error_code,this->db_);
  __cxa_throw(this_00,&Logic_error::typeinfo,Logic_error::~Logic_error);
}

Assistant:

bool Connection::Stmt::step()
    {
        int status = sqlite3_step(stmt_);
        if(status == SQLITE_ROW)
        {
            return true;
        }
        else if(status == SQLITE_DONE)
        {
            return false;
        }
        else
        {
            throw Logic_error("Error evaluating SQL: "s +
                sqlite3_errmsg(db_), sqlite3_sql(stmt_), status, db_);
        }
    }